

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_iter.c
# Opt level: O0

tnt_iter * tnt_iter_map(tnt_iter *i,char *data,size_t size)

{
  int iVar1;
  uint32_t uVar2;
  tnt_iter *ptVar3;
  tnt_iter_map *itr;
  char *tmp_data;
  size_t size_local;
  char *data_local;
  tnt_iter *i_local;
  byte local_9;
  
  itr = (tnt_iter_map *)data;
  tmp_data = (char *)size;
  size_local = (size_t)data;
  data_local = (char *)i;
  iVar1 = mp_check((char **)&itr,data + size);
  if (iVar1 == 0) {
    if (((size_local == 0) || (tmp_data == (char *)0x0)) ||
       (local_9 = *(byte *)size_local, mp_type_hint[local_9] != MP_MAP)) {
      i_local = (tnt_iter *)0x0;
    }
    else {
      ptVar3 = tnt_iter_init((tnt_iter *)data_local);
      if (ptVar3 == (tnt_iter *)0x0) {
        i_local = (tnt_iter *)0x0;
      }
      else {
        ptVar3->type = TNT_ITER_MAP;
        ptVar3->next = tnt_iter_map_next;
        ptVar3->rewind = tnt_iter_map_rewind;
        ptVar3->free = (_func_void_tnt_iter_ptr *)0x0;
        (ptVar3->data).array.data = (char *)size_local;
        (ptVar3->data).array.first_elem = (char *)size_local;
        data_local = (char *)ptVar3;
        uVar2 = mp_decode_map(&(ptVar3->data).array.first_elem);
        (ptVar3->data).map.pair_count = uVar2;
        (ptVar3->data).map.cur_index = -1;
        i_local = (tnt_iter *)data_local;
      }
    }
  }
  else {
    i_local = (tnt_iter *)0x0;
  }
  return i_local;
}

Assistant:

struct tnt_iter *
tnt_iter_map(struct tnt_iter *i, const char *data, size_t size)
{
	const char *tmp_data = data;
	if (mp_check(&tmp_data, data + size) != 0)
		return NULL;
	if (!data || !size || mp_typeof(*data) != MP_MAP)
		return NULL;
	i = tnt_iter_init(i);
	if (i == NULL)
		return NULL;
	i->type = TNT_ITER_MAP;
	i->next = tnt_iter_map_next;
	i->rewind = tnt_iter_map_rewind;
	i->free = NULL;
	struct tnt_iter_map *itr = TNT_IMAP(i);
	itr->data = data;
	itr->first_key = data;
	itr->pair_count = mp_decode_map(&itr->first_key);
	itr->cur_index = -1;
	return i;
}